

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::DecimalCastOperation::
     TruncateExcessiveDecimals<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
               (DecimalCastData<duckdb::hugeint_t> *state)

{
  bool bVar1;
  ulong uVar2;
  hugeint_t mod;
  hugeint_t local_48;
  hugeint_t local_38;
  
  if (state->excessive_decimals == '\0') {
    bVar1 = false;
  }
  else {
    uVar2 = 0;
    do {
      hugeint_t::hugeint_t(&local_38,10);
      local_48 = hugeint_t::operator%(&state->result,&local_38);
      hugeint_t::hugeint_t(&local_38,5);
      bVar1 = hugeint_t::operator>=(&local_48,&local_38);
      hugeint_t::hugeint_t(&local_38,10);
      hugeint_t::operator/=(&state->result,&local_38);
      uVar2 = uVar2 + 1;
    } while (uVar2 < state->excessive_decimals);
  }
  if ((bVar1 != false) && (state->exponent_type == POSITIVE)) {
    hugeint_t::hugeint_t(&local_48,1);
    hugeint_t::operator+=(&state->result,&local_48);
  }
  state->decimal_count = state->scale;
  return true;
}

Assistant:

static bool TruncateExcessiveDecimals(T &state) {
		D_ASSERT(state.excessive_decimals);
		bool round_up = false;
		for (idx_t i = 0; i < state.excessive_decimals; i++) {
			auto mod = state.result % 10;
			round_up = NEGATIVE ? mod <= -5 : mod >= 5;
			state.result /= static_cast<typename T::StoreType>(10.0);
		}
		//! Only round up when exponents are involved
		if (state.exponent_type == ExponentType::POSITIVE && round_up) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		D_ASSERT(state.decimal_count > state.scale);
		state.decimal_count = state.scale;
		return true;
	}